

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O3

IterateResult __thiscall deqp::gles2::Functional::UniformCase::iterate(UniformCase *this)

{
  TestLog *log;
  UniformCollection *pUVar1;
  RenderContext *renderCtx;
  deUint32 dVar2;
  uint uVar3;
  GLenum err;
  int iVar4;
  pointer pUVar5;
  char *description;
  long lVar6;
  long lVar7;
  vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
  basicUniforms;
  vector<deqp::gles2::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportRef>_>
  basicUniformReportsRef;
  string fragmentSource;
  string vertexSource;
  Random rnd;
  ShaderProgram program;
  ProgramSources sources;
  
  dVar2 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  uVar3 = tcu::CommandLine::getBaseSeed(((this->super_TestCase).m_context)->m_testCtx->m_cmdLine);
  deRandom_init(&rnd.m_rnd,dVar2 ^ uVar3);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  basicUniforms.
  super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  basicUniforms.
  super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  basicUniforms.
  super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  basicUniformReportsRef.
  super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportRef>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  basicUniformReportsRef.
  super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportRef>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  basicUniformReportsRef.
  super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportRef>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  pUVar1 = (this->m_uniformCollection).m_ptr;
  pUVar5 = (pUVar1->m_uniforms).
           super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Uniform>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(pUVar1->m_uniforms).
                              super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Uniform>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar5) >> 3) *
          -0x49249249) {
    lVar6 = 0x20;
    lVar7 = 0;
    do {
      generateBasicUniforms
                (this,&basicUniforms,&basicUniformReportsRef,
                 (VarType *)((long)&(pUVar5->name)._M_dataplus._M_p + lVar6),
                 *(char **)((long)pUVar5 + lVar6 + -0x20),true,(int *)&program,&rnd);
      lVar7 = lVar7 + 1;
      pUVar1 = (this->m_uniformCollection).m_ptr;
      pUVar5 = (pUVar1->m_uniforms).
               super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Uniform>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x38;
    } while (lVar7 < (int)((ulong)((long)(pUVar1->m_uniforms).
                                         super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Uniform>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar5)
                          >> 3) * -0x49249249);
  }
  generateVertexSource_abi_cxx11_(&vertexSource,this,&basicUniforms);
  generateFragmentSource_abi_cxx11_(&fragmentSource,this,&basicUniforms);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(&sources,0,0xac);
  sources.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sources.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  sources.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  sources.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  sources._193_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(sources.sources,&vertexSource);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(sources.sources + 1,&fragmentSource);
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,&sources);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&sources.transformFeedbackVaryings);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&sources.attribLocationBindings);
  lVar6 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&sources.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar6));
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x18);
  glu::operator<<(log,&program);
  if (program.m_program.m_info.linkOk == false) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Compile failed");
  }
  else {
    glu::CallLogWrapper::glUseProgram(&this->super_CallLogWrapper,program.m_program.m_program);
    err = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
    glu::checkError(err,"glUseProgram(program.getProgram())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                    ,0x6e5);
    iVar4 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
                      (this,&basicUniforms,&basicUniformReportsRef,&program,&rnd);
    description = "Failed";
    if ((byte)iVar4 != 0) {
      description = "Passed";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               (uint)(byte)((byte)iVar4 ^ 1),description);
  }
  glu::ShaderProgram::~ShaderProgram(&program);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fragmentSource._M_dataplus._M_p != &fragmentSource.field_2) {
    operator_delete(fragmentSource._M_dataplus._M_p,fragmentSource.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)vertexSource._M_dataplus._M_p != &vertexSource.field_2) {
    operator_delete(vertexSource._M_dataplus._M_p,vertexSource.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<deqp::gles2::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportRef>_>
  ::~vector(&basicUniformReportsRef);
  std::
  vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
  ::~vector(&basicUniforms);
  return STOP;
}

Assistant:

UniformCase::IterateResult UniformCase::iterate (void)
{
	Random							rnd				(deStringHash(getName()) ^ (deUint32)m_context.getTestContext().getCommandLine().getBaseSeed());
	TestLog&						log				= m_testCtx.getLog();
	vector<BasicUniform>			basicUniforms;
	vector<BasicUniformReportRef>	basicUniformReportsRef;

	{
		int samplerUnitCounter = 0;
		for (int i = 0; i < (int)m_uniformCollection->getNumUniforms(); i++)
			generateBasicUniforms(basicUniforms, basicUniformReportsRef, m_uniformCollection->getUniform(i).type, m_uniformCollection->getUniform(i).name.c_str(), true, samplerUnitCounter, rnd);
	}

	const string					vertexSource	= generateVertexSource(basicUniforms);
	const string					fragmentSource	= generateFragmentSource(basicUniforms);
	const ShaderProgram				program			(m_context.getRenderContext(), glu::makeVtxFragSources(vertexSource, fragmentSource));

	log << program;

	if (!program.isOk())
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Compile failed");
		return STOP;
	}

	GLU_CHECK_CALL(glUseProgram(program.getProgram()));

	const bool success = test(basicUniforms, basicUniformReportsRef, program, rnd);
	m_testCtx.setTestResult(success ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							success ? "Passed"				: "Failed");

	return STOP;
}